

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

op_t * cast(op_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,op_t op,MIR_type_t t,int new_op_p)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined8 uVar3;
  int64_t iVar4;
  char *pcVar5;
  undefined8 uVar6;
  MIR_disp_t MVar7;
  MIR_type_t MVar8;
  op_t *poVar9;
  undefined4 extraout_var;
  MIR_insn_t_conflict pMVar10;
  op_t *extraout_RAX;
  undefined1 uVar11;
  MIR_insn_code_t MVar12;
  uint uVar13;
  MIR_insn_code_t MVar14;
  MIR_insn_code_t MVar15;
  MIR_context_t ctx;
  op_t *poVar16;
  op_t *poVar17;
  bool bVar18;
  bool bVar19;
  op_t local_b8;
  op_t local_78;
  
  if (MIR_T_LD < t) {
    __assert_fail("t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16 || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_I64 || t == MIR_T_U64 || t == MIR_T_F || t == MIR_T_D || t == MIR_T_LD"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x292d,"op_t cast(c2m_ctx_t, op_t, MIR_type_t, int)");
  }
  poVar16 = &op;
  MVar12 = MIR_INSN_BOUND;
  MVar15 = MIR_INSN_BOUND;
  poVar17 = (op_t *)(ulong)((byte)op.mir_op._8_1_ - 1);
  poVar9 = poVar17;
  if (9 < (byte)op.mir_op._8_1_ - 1) goto switchD_001a5837_caseD_1;
  poVar9 = (op_t *)((long)&switchD_001a5837::switchdataD_001bc480 +
                   (long)(int)(&switchD_001a5837::switchdataD_001bc480)[(long)poVar17]);
  switch(poVar17) {
  case (op_t *)0x0:
    MVar8 = reg_type((c2m_ctx_t)c2m_ctx->ctx,SUB84(c2m_ctx->gen_ctx->curr_func->u,0));
    poVar9 = (op_t *)CONCAT44(extraout_var,MVar8);
LAB_001a58e1:
    if ((char)poVar9 == '\b') goto switchD_001a5837_caseD_4;
    uVar13 = (uint)poVar9 & 0xff;
    if (uVar13 == 9) goto switchD_001a5837_caseD_5;
    if (uVar13 != 10) goto LAB_001a5a3b;
  case (op_t *)0x6:
    MVar15 = MIR_LD2D;
    MVar14 = MIR_LD2F;
    MVar12 = MIR_LD2I;
    bVar19 = t == MIR_T_D;
LAB_001a593a:
    if (!bVar19) {
      MVar15 = MIR_INSN_BOUND;
    }
    if (t != MIR_T_F) {
      MVar14 = MVar15;
    }
LAB_001a5975:
    if (MIR_T_U64 < t) {
      MVar12 = MVar14;
    }
    if (MIR_T_U8 < t) {
      poVar9 = (op_t *)0x8;
      MVar14 = MIR_INSN_BOUND;
      if (t == MIR_T_U16) {
        MVar14 = MIR_UEXT16;
      }
      MVar15 = MIR_EXT16;
      if (t != MIR_T_I16) {
        MVar15 = MVar14;
      }
      break;
    }
    MVar15 = (uint)(t != MIR_T_I8) * 3 + MIR_EXT8;
    MVar14 = MVar12;
LAB_001a5aee:
    MVar12 = MVar14;
    bVar18 = MVar12 == MIR_INSN_BOUND;
    bVar19 = MVar15 == MIR_INSN_BOUND;
    goto LAB_001a5aff;
  case (op_t *)0x2:
    MVar12 = MIR_EXT16;
    if (t < MIR_T_I16) {
      MVar12 = (uint)(t != MIR_T_I8) * 3 + MIR_EXT8;
    }
    MVar14 = MIR_UEXT16;
    if (t < MIR_T_U16) {
      MVar14 = MVar12;
    }
    if ((t < MIR_T_I32) || (MVar14 = MIR_I2F, t == MIR_T_F)) goto LAB_001a5aee;
    poVar9 = (op_t *)0xc;
    poVar17 = (op_t *)0xb;
LAB_001a5a2b:
    if (t != MIR_T_LD) {
      poVar9 = (op_t *)0xbc;
    }
    if (t != MIR_T_D) {
      poVar17 = poVar9;
    }
    MVar12 = (MIR_insn_code_t)poVar17;
    break;
  case (op_t *)0x3:
    MVar12 = MIR_EXT16;
    if (t < MIR_T_I16) {
      MVar12 = (uint)(t != MIR_T_I8) * 3 + MIR_EXT8;
    }
    MVar14 = MIR_UEXT16;
    if (t < MIR_T_U16) {
      MVar14 = MVar12;
    }
    if ((MIR_T_U16 < t) && (MVar14 = MIR_UI2F, t != MIR_T_F)) {
      poVar9 = (op_t *)0xf;
      poVar17 = (op_t *)0xe;
      goto LAB_001a5a2b;
    }
    goto LAB_001a5aee;
  case (op_t *)0x4:
switchD_001a5837_caseD_4:
    MVar12 = MIR_F2I;
    MVar15 = MIR_F2LD;
    if (t != MIR_T_LD) {
      MVar15 = MIR_INSN_BOUND;
    }
    MVar14 = MIR_F2D;
    if (t != MIR_T_D) {
      MVar14 = MVar15;
    }
    goto LAB_001a5975;
  case (op_t *)0x5:
switchD_001a5837_caseD_5:
    MVar15 = MIR_D2LD;
    MVar14 = MIR_D2F;
    MVar12 = MIR_D2I;
    bVar19 = t == MIR_T_LD;
    goto LAB_001a593a;
  case (op_t *)0x9:
    poVar9 = (op_t *)0x12;
    if (op.mir_op.u.reg._0_1_ != '\x12') {
      uVar11 = 6;
      if (6 < (byte)op.mir_op.u.reg._0_1_) {
        uVar11 = op.mir_op.u.reg._0_1_;
      }
      poVar9 = (op_t *)(ulong)(byte)uVar11;
      goto LAB_001a58e1;
    }
LAB_001a5a3b:
    MVar12 = MIR_INSN_BOUND;
    MVar15 = MIR_INSN_BOUND;
    if (1 < t - MIR_T_I32) {
      uVar13 = (uint)poVar9;
      if ((t == MIR_T_U64) || (t == MIR_T_I64)) {
        if (uVar13 == 4) {
          MVar15 = MIR_INSN_BOUND;
          MVar14 = MIR_EXT32;
        }
        else {
          if (uVar13 != 5) break;
          MVar15 = MIR_INSN_BOUND;
          MVar14 = MIR_UEXT32;
        }
      }
      else {
        MVar15 = (uint)(t != MIR_T_I8) * 3 + MIR_EXT8;
        if ((t & (MIR_T_BLK|MIR_T_I16)) == MIR_T_I16) {
          MVar15 = (uint)(t != MIR_T_I16) * 3 + MIR_EXT16;
        }
        MVar14 = MIR_INSN_BOUND;
        if (MIR_T_U16 < t) {
          if (t == MIR_T_F) {
            MVar14 = MIR_UEXT32;
            if (uVar13 != 5) {
              MVar14 = MIR_INSN_BOUND;
            }
            MVar15 = MIR_UI2F;
            if ((uVar13 & 0xfd) != 5) {
              MVar15 = MIR_INSN_BOUND;
            }
            MVar12 = MIR_EXT32;
            if (uVar13 != 4) {
              MVar12 = MVar14;
            }
            MVar14 = MIR_I2F;
          }
          else if (t == MIR_T_D) {
            MVar14 = MIR_UEXT32;
            if (uVar13 != 5) {
              MVar14 = MIR_INSN_BOUND;
            }
            MVar15 = MIR_UI2D;
            if ((uVar13 & 0xfd) != 5) {
              MVar15 = MIR_INSN_BOUND;
            }
            MVar12 = MIR_EXT32;
            if (uVar13 != 4) {
              MVar12 = MVar14;
            }
            MVar14 = MIR_I2D;
          }
          else {
            MVar15 = MIR_INSN_BOUND;
            if (t != MIR_T_LD) break;
            MVar14 = MIR_UEXT32;
            if (uVar13 != 5) {
              MVar14 = MIR_INSN_BOUND;
            }
            MVar15 = MIR_UI2LD;
            if ((uVar13 & 0xfd) != 5) {
              MVar15 = MIR_INSN_BOUND;
            }
            MVar12 = MIR_EXT32;
            if (uVar13 != 4) {
              MVar12 = MVar14;
            }
            MVar14 = MIR_I2LD;
          }
          if (uVar13 == 4) {
            MVar15 = MVar14;
          }
          if (uVar13 == 6) {
            MVar15 = MVar14;
          }
          break;
        }
      }
      goto LAB_001a5aee;
    }
  }
switchD_001a5837_caseD_1:
  bVar18 = MVar12 == MIR_INSN_BOUND;
  bVar19 = MVar15 == MIR_INSN_BOUND;
  if (((new_op_p == 0) && (MVar12 == MIR_INSN_BOUND)) && (MVar15 == MIR_INSN_BOUND))
  goto LAB_001a5cc0;
LAB_001a5aff:
  MVar8 = MIR_T_I64;
  if (MIR_T_U16 < t) {
    MVar8 = t;
  }
  get_new_temp(&local_b8,c2m_ctx,MVar8);
  if ((bVar19) && (bVar18)) {
    if (t == MIR_T_F) {
      MVar15 = MIR_FMOV;
    }
    else if (t == MIR_T_D) {
      MVar15 = MIR_DMOV;
    }
    else {
      MVar15 = (uint)(t == MIR_T_LD) * 3;
    }
    pMVar10 = MIR_new_insn(c2m_ctx->ctx,MVar15);
  }
  else {
    if (bVar18) {
LAB_001a5c70:
      ctx = c2m_ctx->ctx;
      MVar12 = MVar15;
    }
    else {
      if (!bVar19) {
        get_new_temp(&local_78,c2m_ctx,MIR_T_I64);
        pMVar10 = MIR_new_insn(c2m_ctx->ctx,MVar12);
        emit_insn_opt(c2m_ctx,pMVar10);
        goto LAB_001a5c70;
      }
      ctx = c2m_ctx->ctx;
    }
    pMVar10 = MIR_new_insn(ctx,MVar12);
  }
  poVar16 = &local_b8;
  emit_insn_opt(c2m_ctx,pMVar10);
  poVar9 = extraout_RAX;
LAB_001a5cc0:
  uVar1 = *(undefined8 *)&poVar16->field_0x8;
  pvVar2 = (poVar16->mir_op).data;
  uVar3 = *(undefined8 *)&(poVar16->mir_op).field_0x8;
  iVar4 = (poVar16->mir_op).u.i;
  pcVar5 = (poVar16->mir_op).u.str.s;
  uVar6 = *(undefined8 *)((long)&(poVar16->mir_op).u + 0x10);
  MVar7 = (poVar16->mir_op).u.mem.disp;
  __return_storage_ptr__->decl = poVar16->decl;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = uVar1;
  (__return_storage_ptr__->mir_op).data = pvVar2;
  *(undefined8 *)&(__return_storage_ptr__->mir_op).field_0x8 = uVar3;
  (__return_storage_ptr__->mir_op).u.i = iVar4;
  (__return_storage_ptr__->mir_op).u.str.s = pcVar5;
  *(undefined8 *)((long)&(__return_storage_ptr__->mir_op).u + 0x10) = uVar6;
  (__return_storage_ptr__->mir_op).u.mem.disp = MVar7;
  return poVar9;
}

Assistant:

static op_t cast (c2m_ctx_t c2m_ctx, op_t op, MIR_type_t t, int new_op_p) {
  op_t res, interm;
  MIR_type_t op_type;
  MIR_insn_code_t insn_code = MIR_INSN_BOUND, insn_code2 = MIR_INSN_BOUND;

  assert (t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16 || t == MIR_T_I32
          || t == MIR_T_U32 || t == MIR_T_I64 || t == MIR_T_U64 || t == MIR_T_F || t == MIR_T_D
          || t == MIR_T_LD);
  switch (op.mir_op.mode) {
  case MIR_OP_MEM:
    op_type = op.mir_op.u.mem.type;
    if (op_type == MIR_T_UNDEF) { /* ??? it is an array */

    } else if (op_type == MIR_T_I8 || op_type == MIR_T_U8 || op_type == MIR_T_I16
               || op_type == MIR_T_U16 || op_type == MIR_T_I32 || op_type == MIR_T_U32)
      op_type = MIR_T_I64;
    goto all_types;
  case MIR_OP_REG:
    op_type = reg_type (c2m_ctx, op.mir_op.u.reg);
  all_types:
    if (op_type == MIR_T_F) goto float_val;
    if (op_type == MIR_T_D) goto double_val;
    if (op_type == MIR_T_LD) goto ldouble_val;
    if (t == MIR_T_I64) {
      insn_code = (op_type == MIR_T_I32   ? MIR_EXT32
                   : op_type == MIR_T_U32 ? MIR_UEXT32
                   : op_type == MIR_T_F   ? MIR_F2I
                   : op_type == MIR_T_D   ? MIR_D2I
                   : op_type == MIR_T_LD  ? MIR_LD2I
                                          : MIR_INSN_BOUND);
    } else if (t == MIR_T_U64) {
      insn_code = (op_type == MIR_T_I32   ? MIR_EXT32
                   : op_type == MIR_T_U32 ? MIR_UEXT32
                   : op_type == MIR_T_F   ? MIR_F2I
                   : op_type == MIR_T_D   ? MIR_D2I
                   : op_type == MIR_T_LD  ? MIR_LD2I
                                          : MIR_INSN_BOUND);
    } else if (t == MIR_T_I32) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
    } else if (t == MIR_T_U32) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
    } else if (t == MIR_T_I16) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
      insn_code2 = MIR_EXT16;
    } else if (t == MIR_T_U16) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
      insn_code2 = MIR_UEXT16;
    } else if (t == MIR_T_I8) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
      insn_code2 = MIR_EXT8;
    } else if (t == MIR_T_U8) {
      insn_code = (op_type == MIR_T_F    ? MIR_F2I
                   : op_type == MIR_T_D  ? MIR_D2I
                   : op_type == MIR_T_LD ? MIR_LD2I
                                         : MIR_INSN_BOUND);
      insn_code2 = MIR_UEXT8;
    } else if (t == MIR_T_F) {
      insn_code = (op_type == MIR_T_I32   ? MIR_EXT32
                   : op_type == MIR_T_U32 ? MIR_UEXT32
                                          : MIR_INSN_BOUND);
      insn_code2 = (op_type == MIR_T_I64 || op_type == MIR_T_I32   ? MIR_I2F
                    : op_type == MIR_T_U64 || op_type == MIR_T_U32 ? MIR_UI2F
                                                                   : MIR_INSN_BOUND);
    } else if (t == MIR_T_D) {
      insn_code = (op_type == MIR_T_I32   ? MIR_EXT32
                   : op_type == MIR_T_U32 ? MIR_UEXT32
                                          : MIR_INSN_BOUND);
      insn_code2 = (op_type == MIR_T_I64 || op_type == MIR_T_I32   ? MIR_I2D
                    : op_type == MIR_T_U64 || op_type == MIR_T_U32 ? MIR_UI2D
                                                                   : MIR_INSN_BOUND);
    } else if (t == MIR_T_LD) {
      insn_code = (op_type == MIR_T_I32   ? MIR_EXT32
                   : op_type == MIR_T_U32 ? MIR_UEXT32
                                          : MIR_INSN_BOUND);
      insn_code2 = (op_type == MIR_T_I64 || op_type == MIR_T_I32   ? MIR_I2LD
                    : op_type == MIR_T_U64 || op_type == MIR_T_U32 ? MIR_UI2LD
                                                                   : MIR_INSN_BOUND);
    }
    break;
  case MIR_OP_INT:
    insn_code = (t == MIR_T_I8    ? MIR_EXT8
                 : t == MIR_T_U8  ? MIR_UEXT8
                 : t == MIR_T_I16 ? MIR_EXT16
                 : t == MIR_T_U16 ? MIR_UEXT16
                 : t == MIR_T_F   ? MIR_I2F
                 : t == MIR_T_D   ? MIR_I2D
                 : t == MIR_T_LD  ? MIR_I2LD
                                  : MIR_INSN_BOUND);
    break;
  case MIR_OP_UINT:
    insn_code = (t == MIR_T_I8    ? MIR_EXT8
                 : t == MIR_T_U8  ? MIR_UEXT8
                 : t == MIR_T_I16 ? MIR_EXT16
                 : t == MIR_T_U16 ? MIR_UEXT16
                 : t == MIR_T_F   ? MIR_UI2F
                 : t == MIR_T_D   ? MIR_UI2D
                 : t == MIR_T_LD  ? MIR_UI2LD
                                  : MIR_INSN_BOUND);
    break;
  case MIR_OP_FLOAT:
  float_val:
    insn_code = (t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16
                     || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_I64 || t == MIR_T_U64
                   ? MIR_F2I
                 : t == MIR_T_D  ? MIR_F2D
                 : t == MIR_T_LD ? MIR_F2LD
                                 : MIR_INSN_BOUND);
    insn_code2 = (t == MIR_T_I8    ? MIR_EXT8
                  : t == MIR_T_U8  ? MIR_UEXT8
                  : t == MIR_T_I16 ? MIR_EXT16
                  : t == MIR_T_U16 ? MIR_UEXT16
                                   : MIR_INSN_BOUND);
    break;
  case MIR_OP_DOUBLE:
  double_val:
    insn_code = (t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16
                     || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_I64 || t == MIR_T_U64
                   ? MIR_D2I
                 : t == MIR_T_F  ? MIR_D2F
                 : t == MIR_T_LD ? MIR_D2LD
                                 : MIR_INSN_BOUND);
    insn_code2 = (t == MIR_T_I8    ? MIR_EXT8
                  : t == MIR_T_U8  ? MIR_UEXT8
                  : t == MIR_T_I16 ? MIR_EXT16
                  : t == MIR_T_U16 ? MIR_UEXT16
                                   : MIR_INSN_BOUND);
    break;
  case MIR_OP_LDOUBLE:
  ldouble_val:
    insn_code = (t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16
                     || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_I64 || t == MIR_T_U64
                   ? MIR_LD2I
                 : t == MIR_T_F ? MIR_LD2F
                 : t == MIR_T_D ? MIR_LD2D
                                : MIR_INSN_BOUND);
    insn_code2 = (t == MIR_T_I8    ? MIR_EXT8
                  : t == MIR_T_U8  ? MIR_UEXT8
                  : t == MIR_T_I16 ? MIR_EXT16
                  : t == MIR_T_U16 ? MIR_UEXT16
                                   : MIR_INSN_BOUND);
    break;
  default: break;
  }
  if (!new_op_p && insn_code == MIR_INSN_BOUND && insn_code2 == MIR_INSN_BOUND) return op;
  res = get_new_temp (c2m_ctx, t == MIR_T_I8 || t == MIR_T_U8 || t == MIR_T_I16 || t == MIR_T_U16
                                 ? MIR_T_I64
                                 : t);
  if (insn_code == MIR_INSN_BOUND && insn_code2 == MIR_INSN_BOUND) {
    emit2 (c2m_ctx, tp_mov (t), res.mir_op, op.mir_op);
  } else if (insn_code == MIR_INSN_BOUND) {
    emit2 (c2m_ctx, insn_code2, res.mir_op, op.mir_op);
  } else if (insn_code2 == MIR_INSN_BOUND) {
    emit2 (c2m_ctx, insn_code, res.mir_op, op.mir_op);
  } else {
    interm = get_new_temp (c2m_ctx, MIR_T_I64);
    emit2 (c2m_ctx, insn_code, interm.mir_op, op.mir_op);
    emit2 (c2m_ctx, insn_code2, res.mir_op, interm.mir_op);
  }
  return res;
}